

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::command_line::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
operator()(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *__return_storage_ptr__,
          parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *this,string *v)

{
  bool bVar1;
  difference_type dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  local_48;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  pos;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  local_30;
  const_iterator end;
  const_iterator begin;
  string *v_local;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *this_local;
  
  end = parser_base::begin(&this->super_parser_base);
  pos._M_current = (literal *)parser_base::end(&this->super_parser_base);
  local_30._M_current = pos._M_current;
  dVar2 = std::
          distance<__gnu_cxx::__normal_iterator<pstore::command_line::literal_const*,std::vector<pstore::command_line::literal,std::allocator<pstore::command_line::literal>>>>
                    ((__normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
                      )end._M_current,pos);
  value = extraout_RDX;
  if (dVar2 != 0) {
    local_48 = std::operator()(end._M_current,local_30,(anon_class_8_1_54a39816_for__M_pred)v);
    bVar1 = __gnu_cxx::operator==(&local_48,&local_30);
    value = extraout_RDX_00;
    if (bVar1) {
      nothing<std::__cxx11::string>();
      return __return_storage_ptr__;
    }
  }
  just<std::__cxx11::string_const&>(__return_storage_ptr__,(pstore *)v,value);
  return __return_storage_ptr__;
}

Assistant:

maybe<std::string> parser<std::string>::operator() (std::string const & v) const {
                // If this one of the literal strings?
                auto const begin = this->begin ();
                auto const end = this->end ();
                if (std::distance (begin, end) != 0) {
                    auto const pos = std::find_if (
                        begin, end, [&v] (literal const & lit) { return v == lit.name; });
                    if (pos == end) {
                        return nothing<std::string> ();
                    }
                }
                return just (v);
            }